

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_impl.c
# Opt level: O2

plugin plugin_create(char *name,plugin_descriptor descriptor,void *iface,void *impl,
                    _func_void_plugin *dtor)

{
  size_t sVar1;
  plugin p;
  char *pcVar2;
  ulong __size;
  undefined8 uStack_40;
  
  if (name == (char *)0x0) {
    pcVar2 = "Invalid plugin name";
    uStack_40 = 0x2e;
  }
  else {
    sVar1 = strlen(name);
    __size = sVar1 + 1;
    if (__size < 2) {
      pcVar2 = "Invalid plugin name length";
      uStack_40 = 0x36;
    }
    else {
      p = (plugin)malloc(0x28);
      if (p != (plugin)0x0) {
        p->descriptor = descriptor;
        p->iface = iface;
        p->impl = impl;
        p->dtor = dtor;
        pcVar2 = (char *)malloc(__size);
        p->name = pcVar2;
        if (pcVar2 != (char *)0x0) {
          memcpy(pcVar2,name,__size);
          return p;
        }
        log_write_impl_va("metacall",0x4a,"plugin_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                          ,3,"Invalid plugin name allocation");
        plugin_destroy(p);
        return (plugin)0x0;
      }
      pcVar2 = "Invalid plugin allocation";
      uStack_40 = 0x3e;
    }
  }
  log_write_impl_va("metacall",uStack_40,"plugin_create",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_impl.c"
                    ,3,pcVar2);
  return (plugin)0x0;
}

Assistant:

plugin plugin_create(const char *name, plugin_descriptor descriptor, void *iface, void *impl, void (*dtor)(plugin))
{
	if (name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name");
		return NULL;
	}

	size_t name_size = strlen(name) + 1;

	if (name_size <= 1)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name length");
		return NULL;
	}

	plugin p = malloc(sizeof(struct plugin_type));

	if (p == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin allocation");
		return NULL;
	}

	p->descriptor = descriptor;
	p->iface = iface;
	p->impl = impl;
	p->dtor = dtor;
	p->name = malloc(sizeof(char) * name_size);

	if (p->name == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin name allocation");
		plugin_destroy(p);
		return NULL;
	}

	memcpy(p->name, name, name_size);

	return p;
}